

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O0

int experience(monst *mtmp,int nk)

{
  byte bVar1;
  permonst *ppVar2;
  int iVar3;
  int iVar4;
  int local_28;
  int tmp2;
  int tmp;
  int i;
  permonst *ptr;
  int nk_local;
  monst *mtmp_local;
  
  ppVar2 = mtmp->data;
  local_28 = (uint)mtmp->m_lev * (uint)mtmp->m_lev + 1;
  iVar3 = find_mac(mtmp);
  if (iVar3 < 3) {
    iVar4 = 1;
    if (iVar3 < 0) {
      iVar4 = 2;
    }
    local_28 = (7 - iVar3) * iVar4 + local_28;
  }
  if ('\f' < ppVar2->mmove) {
    iVar3 = 3;
    if ('\x12' < ppVar2->mmove) {
      iVar3 = 5;
    }
    local_28 = iVar3 + local_28;
  }
  for (tmp2 = 0; tmp2 < 6; tmp2 = tmp2 + 1) {
    bVar1 = ppVar2->mattk[tmp2].aatyp;
    if (4 < bVar1) {
      if (bVar1 == 0xfe) {
        local_28 = local_28 + 5;
      }
      else if (bVar1 == 0xff) {
        local_28 = local_28 + 10;
      }
      else {
        local_28 = local_28 + 3;
      }
    }
  }
  for (tmp2 = 0; tmp2 < 6; tmp2 = tmp2 + 1) {
    bVar1 = ppVar2->mattk[tmp2].adtyp;
    if ((bVar1 == 0) || (10 < bVar1)) {
      if ((bVar1 == 0xf) || ((bVar1 == 0x12 || (bVar1 == 0x28)))) {
        local_28 = local_28 + 0x32;
      }
      else if (local_28 != 0) {
        local_28 = (uint)mtmp->m_lev + local_28;
      }
    }
    else {
      local_28 = (uint)mtmp->m_lev * 2 + local_28;
    }
    if (0x17 < (uint)ppVar2->mattk[tmp2].damd * (uint)ppVar2->mattk[tmp2].damn) {
      local_28 = (uint)mtmp->m_lev + local_28;
    }
    if ((((bVar1 == 0x1c) && (ppVar2->mlet == '9')) && (u.uprops[0x31].intrinsic == 0)) &&
       ((u.uprops[0x31].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x600) == 0)))) {
      local_28 = local_28 + 1000;
    }
  }
  if ((ppVar2->mflags2 & 0x2000000) != 0) {
    local_28 = (uint)mtmp->m_lev * 7 + local_28;
  }
  if (8 < mtmp->m_lev) {
    local_28 = local_28 + 0x32;
  }
  return local_28;
}

Assistant:

int experience(struct monst *mtmp, int nk)
{
	const struct permonst *ptr = mtmp->data;
	int	i, tmp, tmp2;

	tmp = 1 + mtmp->m_lev * mtmp->m_lev;

/*	For higher ac values, give extra experience */
	if ((i = find_mac(mtmp)) < 3) tmp += (7 - i) * ((i < 0) ? 2 : 1);

/*	For very fast monsters, give extra experience */
	if (ptr->mmove > NORMAL_SPEED)
	    tmp += (ptr->mmove > (3*NORMAL_SPEED/2)) ? 5 : 3;

/*	For each "special" attack type give extra experience */
	for (i = 0; i < NATTK; i++) {

	    tmp2 = ptr->mattk[i].aatyp;
	    if (tmp2 > AT_BUTT) {

		if (tmp2 == AT_WEAP) tmp += 5;
		else if (tmp2 == AT_MAGC) tmp += 10;
		else tmp += 3;
	    }
	}

/*	For each "special" damage type give extra experience */
	for (i = 0; i < NATTK; i++) {
	    tmp2 = ptr->mattk[i].adtyp;
	    if (tmp2 > AD_PHYS && tmp2 < AD_BLND) tmp += 2*mtmp->m_lev;
	    else if ((tmp2 == AD_DRLI) || (tmp2 == AD_STON) ||
	    		(tmp2 == AD_SLIM)) tmp += 50;
	    else if (tmp != AD_PHYS) tmp += mtmp->m_lev;
		/* extra heavy damage bonus */
	    if ((int)(ptr->mattk[i].damd * ptr->mattk[i].damn) > 23)
		tmp += mtmp->m_lev;
	    if (tmp2 == AD_WRAP && ptr->mlet == S_EEL && !Amphibious)
		tmp += 1000;
	}

/*	For certain "extra nasty" monsters, give even more */
	if (extra_nasty(ptr)) tmp += (7 * mtmp->m_lev);

/*	For higher level monsters, an additional bonus is given */
	if (mtmp->m_lev > 8) tmp += 50;

	return tmp;
}